

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O0

int lws_ssl_client_connect2(lws *wsi,char *errbuf,int len)

{
  lws_ssl_capable_status lVar1;
  int iVar2;
  int n;
  int len_local;
  char *errbuf_local;
  lws *wsi_local;
  
  if ((wsi->wsistate & 0xffff) != 0x204) goto switchD_0013cd99_default;
  lVar1 = lws_tls_client_connect(wsi);
  _lws_log(0x10,"%s: SSL_connect says %d\n","lws_ssl_client_connect2",(ulong)(uint)lVar1);
  switch(lVar1) {
  case LWS_SSL_CAPABLE_DONE:
  default:
switchD_0013cd99_default:
    iVar2 = lws_tls_client_confirm_peer_cert(wsi,errbuf,len);
    if (iVar2 == 0) {
      wsi_local._4_4_ = 1;
    }
    else {
      wsi_local._4_4_ = -1;
    }
    break;
  case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
    lws_callback_on_writable(wsi);
  case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
    lwsi_set_state(wsi,0x204);
  case LWS_SSL_CAPABLE_MORE_SERVICE:
    wsi_local._4_4_ = 0;
    break;
  case LWS_SSL_CAPABLE_ERROR:
    lws_snprintf(errbuf,(long)len,"client connect failed");
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_ssl_client_connect2(struct lws *wsi, char *errbuf, int len)
{
	int n;

	if (lwsi_state(wsi) == LRS_WAITING_SSL) {
		n = lws_tls_client_connect(wsi);
		lwsl_debug("%s: SSL_connect says %d\n", __func__, n);

		switch (n) {
		case LWS_SSL_CAPABLE_ERROR:
			lws_snprintf(errbuf, len, "client connect failed");
			return -1;
		case LWS_SSL_CAPABLE_DONE:
			break; /* connected */
		case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
			lws_callback_on_writable(wsi);
			/* fallthru */
		case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
			lwsi_set_state(wsi, LRS_WAITING_SSL);
			/* fallthru */
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			return 0;
		}
	}

	if (lws_tls_client_confirm_peer_cert(wsi, errbuf, len))
		return -1;

	return 1;
}